

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  string asStack_28 [32];
  
  get_libc_version_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,asStack_28);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(asStack_28);
  return 0;
}

Assistant:

int main(){
    std::cout << get_libc_version() << "\n";
    return 0;
}